

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

void print_cycles<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::ofstream>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,
               basic_ofstream<char,_std::char_traits<char>_> *os)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var1;
  undefined1 local_40 [16];
  
  while (first._M_current != last._M_current) {
    _Var1 = std::
            __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                      (first._M_current + 1,last._M_current,first._M_current);
    std::
    copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::ostream_iterator<int,char,std::char_traits<char>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_40,first,
               (ostream_iterator<int,_char,_std::char_traits<char>_> *)(_Var1._M_current + 1));
    std::operator<<((ostream *)os,"\n");
    first._M_current = _Var1._M_current + 1;
  }
  return;
}

Assistant:

void print_cycles(ForwardIterator first, ForwardIterator last, OutputStream &os)
{
    using T = typename std::iterator_traits<ForwardIterator>::value_type;
    while (first != last)
    {
        auto const cycle_start = first++;
        first = ++find(first, last, *cycle_start);
        copy(cycle_start, first, std::ostream_iterator<T>(os, " "));
        os << "\n";
    }
}